

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::FillForwardDeclarations
          (FileGenerator *this,ForwardDeclarations *decls)

{
  FileDescriptor *pFVar1;
  pointer ppEVar2;
  pointer ppMVar3;
  pointer pbVar4;
  ulong uVar5;
  long lVar6;
  FileGenerator dependency;
  FileGenerator local_230;
  
  pFVar1 = this->file_;
  if (0 < *(int *)(pFVar1 + 0x38)) {
    lVar6 = 0;
    do {
      pFVar1 = FileDescriptor::dependency(pFVar1,*(int *)(*(long *)(pFVar1 + 0x40) + lVar6 * 4));
      FileGenerator(&local_230,pFVar1,&this->options_);
      FillForwardDeclarations(&local_230,decls);
      ~FileGenerator(&local_230);
      lVar6 = lVar6 + 1;
      pFVar1 = this->file_;
    } while (lVar6 < *(int *)(pFVar1 + 0x38));
  }
  pbVar4 = (this->package_parts_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->package_parts_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar4) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      decls = ForwardDeclarations::AddOrGetNamespace
                        (decls,(string *)((long)&(pbVar4->_M_dataplus)._M_p + lVar6));
      uVar5 = uVar5 + 1;
      pbVar4 = (this->package_parts_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x20;
    } while (uVar5 < (ulong)((long)(this->package_parts_).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5));
  }
  ppEVar2 = (this->enum_generators_).
            super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->enum_generators_).
      super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppEVar2) {
    uVar5 = 0;
    do {
      EnumGenerator::FillForwardDeclaration(ppEVar2[uVar5],&decls->enums_);
      uVar5 = uVar5 + 1;
      ppEVar2 = (this->enum_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->enum_generators_).
                                   super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar2 >> 3))
    ;
  }
  ppMVar3 = (this->message_generators_).
            super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->message_generators_).
      super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppMVar3) {
    uVar5 = 0;
    do {
      MessageGenerator::FillMessageForwardDeclarations(ppMVar3[uVar5],&decls->classes_);
      uVar5 = uVar5 + 1;
      ppMVar3 = (this->message_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->message_generators_).
                                   super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar3 >> 3))
    ;
  }
  return;
}

Assistant:

void FileGenerator::FillForwardDeclarations(ForwardDeclarations* decls) {
  for (int i = 0; i < file_->public_dependency_count(); i++) {
    FileGenerator dependency(file_->public_dependency(i), options_);
    dependency.FillForwardDeclarations(decls);
  }
  for (int i = 0; i < package_parts_.size(); i++) {
    decls = decls->AddOrGetNamespace(package_parts_[i]);
  }
  // Generate enum definitions.
  for (int i = 0; i < enum_generators_.size(); i++) {
    enum_generators_[i]->FillForwardDeclaration(&decls->enums());
  }
  // Generate forward declarations of classes.
  for (int i = 0; i < message_generators_.size(); i++) {
    message_generators_[i]->FillMessageForwardDeclarations(
        &decls->classes());
  }
}